

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

KeyInfo * sqlite3KeyInfoAlloc(sqlite3 *db,int N,int X)

{
  int iVar1;
  KeyInfo *pKVar2;
  KeyInfo *p;
  int nExtra;
  int X_local;
  int N_local;
  sqlite3 *db_local;
  
  iVar1 = (N + X) * 9;
  pKVar2 = (KeyInfo *)sqlite3DbMallocRawNN(db,(long)iVar1 + 0x28);
  if (pKVar2 == (KeyInfo *)0x0) {
    sqlite3OomFault(db);
  }
  else {
    pKVar2->aSortOrder = (u8 *)(pKVar2->aColl + (N + X));
    pKVar2->nField = (u16)N;
    pKVar2->nXField = (u16)X;
    pKVar2->enc = db->enc;
    pKVar2->db = db;
    pKVar2->nRef = 1;
    memset(pKVar2 + 1,0,(long)iVar1);
  }
  return pKVar2;
}

Assistant:

SQLITE_PRIVATE KeyInfo *sqlite3KeyInfoAlloc(sqlite3 *db, int N, int X){
  int nExtra = (N+X)*(sizeof(CollSeq*)+1);
  KeyInfo *p = sqlite3DbMallocRawNN(db, sizeof(KeyInfo) + nExtra);
  if( p ){
    p->aSortOrder = (u8*)&p->aColl[N+X];
    p->nField = (u16)N;
    p->nXField = (u16)X;
    p->enc = ENC(db);
    p->db = db;
    p->nRef = 1;
    memset(&p[1], 0, nExtra);
  }else{
    sqlite3OomFault(db);
  }
  return p;
}